

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

iterator * __thiscall
google::
dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
::insert_at<std::pair<int_const,int>const&>
          (iterator *__return_storage_ptr__,
          dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
          *this,size_type pos,pair<const_int,_int> *args)

{
  long lVar1;
  long lVar2;
  length_error *this_00;
  
  lVar1 = *(long *)(this + 0x28);
  if ((ulong)(*(long *)(this + 0x30) - lVar1) < 0x1fffffffffffffff) {
    if ((lVar1 == 0) || (*(int *)(this + 0x20) != *(int *)(*(long *)(this + 0x48) + pos * 8))) {
      *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
    }
    else {
      *(long *)(this + 0x28) = lVar1 + -1;
    }
    *(pair<const_int,_int> *)(*(long *)(this + 0x48) + pos * 8) = *args;
    lVar1 = *(long *)(this + 0x38);
    lVar2 = *(long *)(this + 0x48);
    __return_storage_ptr__->ht =
         (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          *)this;
    __return_storage_ptr__->pos = (pointer)(lVar2 + pos * 8);
    __return_storage_ptr__->end = (pointer)(lVar2 + lVar1 * 8);
    return __return_storage_ptr__;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"insert overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

size_type size() const { return num_elements - num_deleted; }